

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_6.cpp
# Opt level: O2

int main(void)

{
  long lVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator<char> aStack_158;
  allocator_type local_157;
  allocator<char> local_156;
  allocator<char> local_155;
  allocator<char> local_154;
  allocator<char> local_153;
  allocator<char> local_152;
  allocator<char> local_151;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strings;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  reversed_strings;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"Mercury",(allocator<char> *)&reversed_strings);
  std::__cxx11::string::string<std::allocator<char>>(local_100,"Venus",&aStack_158);
  std::__cxx11::string::string<std::allocator<char>>(local_e0,"Earth",&local_151);
  std::__cxx11::string::string<std::allocator<char>>(local_c0,"Mars",&local_152);
  std::__cxx11::string::string<std::allocator<char>>(local_a0,"Jupiter",&local_153);
  std::__cxx11::string::string<std::allocator<char>>(local_80,"Saturn",&local_154);
  std::__cxx11::string::string<std::allocator<char>>(local_60,"Uranus",&local_155);
  std::__cxx11::string::string<std::allocator<char>>(local_40,"Neptune",&local_156);
  __l._M_len = 8;
  __l._M_array = &local_120;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&strings,__l,&local_157);
  lVar1 = 0xe0;
  do {
    std::__cxx11::string::~string((string *)((long)&local_120._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  reverse<std::__cxx11::string>(&reversed_strings,&strings);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"reversed",&aStack_158);
  print<std::__cxx11::string>(&local_120,&reversed_strings);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"original",&aStack_158);
  print<std::__cxx11::string>(&local_120,&strings);
  std::__cxx11::string::~string((string *)&local_120);
  reverse<std::__cxx11::string>(&strings);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"reversed",&aStack_158);
  print<std::__cxx11::string>(&local_120,&strings);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"original",&aStack_158);
  print<std::__cxx11::string>(&local_120,&strings);
  std::__cxx11::string::~string((string *)&local_120);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&reversed_strings);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&strings);
  return 0;
}

Assistant:

int main()
{
	std::vector<std::string> strings = {
		"Mercury",
		"Venus",
		"Earth",
		"Mars",
		"Jupiter",
		"Saturn",
		"Uranus",
		"Neptune"
	};

	const auto& cstrings = strings;
	auto reversed_strings = reverse(cstrings);
	print("reversed", reversed_strings);
	print("original", strings);
	reverse(strings);
	print("reversed", strings);
	print("original", strings);

	return 0;
}